

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::InternalSwap
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  int *in_RSI;
  int *in_RDI;
  
  std::swap<void*>((void **)(in_RDI + 2),(void **)(in_RSI + 2));
  std::swap<int>(in_RDI,in_RSI);
  std::swap<int>(in_RDI + 1,in_RSI + 1);
  return;
}

Assistant:

inline void RepeatedField<Element>::InternalSwap(RepeatedField* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(arena_or_elements_, other->arena_or_elements_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}